

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall
wabt::OptionParser::HandleArgument(OptionParser *this,size_t *arg_index,char *arg_value)

{
  ulong uVar1;
  pointer pAVar2;
  char *local_18;
  
  uVar1 = *arg_index;
  pAVar2 = (this->arguments_).
           super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->arguments_).
                     super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 4) *
             -0x3333333333333333) <= uVar1) {
    Errorf(this,"unexpected argument \'%s\'");
    return;
  }
  local_18 = arg_value;
  if (pAVar2[uVar1].callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*pAVar2[uVar1].callback._M_invoker)((_Any_data *)&pAVar2[uVar1].callback,&local_18);
    pAVar2[uVar1].handled_count = pAVar2[uVar1].handled_count + 1;
    if (pAVar2[uVar1].count == One) {
      *arg_index = *arg_index + 1;
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void OptionParser::HandleArgument(size_t* arg_index, const char* arg_value) {
  if (*arg_index >= arguments_.size()) {
    Errorf("unexpected argument '%s'", arg_value);
    return;
  }
  Argument& argument = arguments_[*arg_index];
  argument.callback(arg_value);
  argument.handled_count++;

  if (argument.count == ArgumentCount::One) {
    (*arg_index)++;
  }
}